

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  impl_string_type *piVar1;
  error_code *peVar2;
  size_type sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  bool bVar6;
  __type _Var7;
  error_category *peVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  path local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  path *local_188;
  error_code *local_180;
  path target;
  path work;
  file_status fs;
  string local_130 [32];
  file_status sls;
  ulong local_108;
  iterator __begin3;
  path root;
  path pe;
  iterator __end3;
  
  if ((p->_path)._M_string_length == 0) {
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  bVar6 = path::has_root_directory(p);
  if (bVar6) {
    std::__cxx11::string::string((string *)&work,(string *)p);
  }
  else {
    absolute(&work,p,ec);
  }
  path::root_path(&root,&work);
  local_1b0._path._M_dataplus._M_p = (pointer)((long)&local_1b0 + 0x10);
  local_1b0._path._M_string_length = 0;
  local_1b0._path.field_2._M_local_buf[0] = '\0';
  status((filesystem *)&fs,&work,ec);
  if (ec->_M_value == 0) {
    if (fs._type != not_found) {
      local_190 = &(__return_storage_ptr__->_path).field_2;
      local_188 = __return_storage_ptr__;
      local_180 = ec;
      do {
        local_1b0._path._M_string_length = 0;
        *local_1b0._path._M_dataplus._M_p = '\0';
        path::begin(&__begin3,&work);
        path::end(&__end3,&work);
        bVar6 = false;
        while( true ) {
          cVar5._M_current = __end3._iter._M_current;
          cVar4._M_current = __begin3._iter._M_current;
          if (__begin3._iter._M_current == __end3._iter._M_current) break;
          std::__cxx11::string::string((string *)&pe._path,(string *)&__begin3._current);
          if (pe._path._M_string_length == 0) {
LAB_0014bab6:
            std::__cxx11::string::~string((string *)&pe._path);
          }
          else {
            path::path<char[2],ghc::filesystem::path>
                      ((path *)&target._path,(char (*) [2])0x17c739,auto_format);
            _Var7 = std::operator==(&pe._path,&target._path);
            std::__cxx11::string::~string((string *)&target);
            if (_Var7) goto LAB_0014bab6;
            path::path<char[3],ghc::filesystem::path>
                      ((path *)&target._path,(char (*) [3])"..",auto_format);
            _Var7 = std::operator==(&pe._path,&target._path);
            std::__cxx11::string::~string((string *)&target._path);
            if (_Var7) {
              path::parent_path((path *)&target._path,&local_1b0);
              std::__cxx11::string::operator=((string *)&local_1b0,(string *)&target._path);
              std::__cxx11::string::~string((string *)&target._path);
              goto LAB_0014bab6;
            }
            operator/((path *)local_130,&local_1b0,(path *)&pe._path);
            std::__cxx11::string::string((string *)&target,local_130);
            sVar3 = target._path._M_string_length;
            std::__cxx11::string::string((string *)&sls,(string *)&root);
            std::__cxx11::string::~string((string *)&sls);
            std::__cxx11::string::~string((string *)&target);
            std::__cxx11::string::~string(local_130);
            if (sVar3 <= local_108) {
              path::operator/=(&local_1b0,(path *)&pe._path);
              goto LAB_0014bab6;
            }
            operator/(&target,&local_1b0,(path *)&pe._path);
            peVar2 = local_180;
            symlink_status((path *)&sls,(error_code *)&target);
            std::__cxx11::string::~string((string *)&target);
            if (peVar2->_M_value != 0) {
              (local_188->_path)._M_dataplus._M_p = (pointer)local_190;
              (local_188->_path)._M_string_length = 0;
              (local_188->_path).field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::~string((string *)&pe._path);
              break;
            }
            if (sls._type != symlink) {
              path::operator/=(&local_1b0,(path *)&pe._path);
              goto LAB_0014bab6;
            }
            operator/((path *)local_130,&local_1b0,(path *)&pe._path);
            peVar2 = local_180;
            read_symlink(&target,(path *)local_130,local_180);
            std::__cxx11::string::~string(local_130);
            if (peVar2->_M_value != 0) {
              (local_188->_path)._M_dataplus._M_p = (pointer)local_190;
              (local_188->_path)._M_string_length = 0;
              (local_188->_path).field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::~string((string *)&target);
              std::__cxx11::string::~string((string *)&pe._path);
              bVar6 = true;
              break;
            }
            bVar6 = path::has_root_directory(&target);
            if (bVar6) {
              std::__cxx11::string::_M_assign((string *)&local_1b0);
            }
            else {
              path::operator/=(&local_1b0,&target);
            }
            std::__cxx11::string::~string((string *)&target);
            std::__cxx11::string::~string((string *)&pe._path);
            bVar6 = true;
          }
          path::iterator::operator++(&__begin3);
        }
        std::__cxx11::string::~string((string *)&__end3._current);
        std::__cxx11::string::~string((string *)&__begin3._current);
        __return_storage_ptr__ = local_188;
        if (cVar4._M_current != cVar5._M_current) goto LAB_0014b7fc;
        std::__cxx11::string::_M_assign((string *)&work);
      } while (bVar6);
      std::error_code::clear(local_180);
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_190;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_1b0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._path._M_dataplus._M_p == paVar9) {
        local_190->_M_allocated_capacity =
             CONCAT71(local_1b0._path.field_2._M_allocated_capacity._1_7_,
                      local_1b0._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_190 + 8) = local_1b0._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_1b0._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_1b0._path.field_2._M_allocated_capacity._1_7_,
                      local_1b0._path.field_2._M_local_buf[0]);
      }
      piVar1 = &local_1b0._path;
      (__return_storage_ptr__->_path)._M_string_length = local_1b0._path._M_string_length;
      local_1b0._path._M_dataplus._M_p = (pointer)paVar9;
      goto LAB_0014b7f5;
    }
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
  }
  paVar9 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar9;
  piVar1 = &__return_storage_ptr__->_path;
LAB_0014b7f5:
  piVar1->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
LAB_0014b7fc:
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::~string((string *)&work);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path root = work.root_path();
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= root.string().length()) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}